

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cc
# Opt level: O1

shared_ptr<mcc::Token> __thiscall mcc::Scanner::GetToken(Scanner *this)

{
  uint int_value;
  ErrorReporter *pEVar1;
  byte c;
  char c_00;
  int iVar2;
  undefined8 *puVar3;
  const_iterator cVar4;
  mapped_type *pmVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_22;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_23;
  Scanner *in_RSI;
  shared_ptr<mcc::Token> sVar7;
  string identifier;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  c = NextCharSkipSpaces(in_RSI);
  this->reporter_ = (ErrorReporter *)0x0;
  puVar3 = (undefined8 *)operator_new(0x40);
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_001429f0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = puVar3 + 6;
  puVar3[5] = 0;
  *(undefined1 *)(puVar3 + 6) = 0;
  *(undefined8 **)&(this->keywords_)._M_t._M_impl = puVar3;
  this->reporter_ = (ErrorReporter *)(puVar3 + 2);
  *(int *)(puVar3 + 2) = in_RSI->line_;
  *(int *)(puVar3 + 3) = in_RSI->c_;
  _Var6._M_pi = extraout_RDX;
  if (0x5c < c) {
    if (0x7a < c) {
      switch(c) {
      case 0x7b:
        *(undefined4 *)((long)puVar3 + 0x1c) = 3;
        break;
      case 0x7c:
        c_00 = Next(in_RSI);
        _Var6._M_pi = extraout_RDX_03;
        if (c_00 == '=') {
          *(undefined4 *)((long)puVar3 + 0x1c) = 0x22;
          break;
        }
        if (c_00 == '|') {
          *(undefined4 *)((long)puVar3 + 0x1c) = 0x2a;
          break;
        }
        *(undefined4 *)((long)puVar3 + 0x1c) = 0x24;
        goto LAB_001210c9;
      case 0x7d:
        *(undefined4 *)((long)puVar3 + 0x1c) = 4;
        break;
      case 0x7e:
        *(undefined4 *)((long)puVar3 + 0x1c) = 8;
        break;
      default:
        if (c == 0xff) {
          *(undefined4 *)((long)puVar3 + 0x1c) = 0;
          break;
        }
        goto switchD_00120b5c_caseD_23;
      }
      goto LAB_001210d5;
    }
    if (c == 0x5d) {
      *(undefined4 *)((long)puVar3 + 0x1c) = 0xc;
      goto LAB_001210d5;
    }
    if (c != 0x5e) goto switchD_00120b5c_caseD_23;
    c_00 = Next(in_RSI);
    if (c_00 == '=') {
      *(undefined4 *)((long)puVar3 + 0x1c) = 0x21;
      _Var6._M_pi = extraout_RDX_01;
      goto LAB_001210d5;
    }
    *(undefined4 *)((long)puVar3 + 0x1c) = 0x25;
    goto LAB_001210c9;
  }
  switch(c) {
  case 0x21:
    c_00 = Next(in_RSI);
    if (c_00 == '=') {
      *(undefined4 *)((long)puVar3 + 0x1c) = 0x13;
      _Var6._M_pi = extraout_RDX_00;
      goto LAB_001210d5;
    }
    *(undefined4 *)((long)puVar3 + 0x1c) = 7;
    break;
  case 0x22:
    ScanStr_abi_cxx11_(&local_50,in_RSI);
    std::__cxx11::string::operator=((string *)(puVar3 + 4),(string *)&local_50);
    _Var6._M_pi = extraout_RDX_11;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      _Var6._M_pi = extraout_RDX_12;
    }
    *(undefined4 *)((long)puVar3 + 0x1c) = 0x2f;
    goto LAB_001210d5;
  case 0x23:
  case 0x24:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    goto switchD_00120b5c_caseD_23;
  case 0x25:
    c_00 = Next(in_RSI);
    if (c_00 == '=') {
      *(undefined4 *)((long)puVar3 + 0x1c) = 0x1d;
      _Var6._M_pi = extraout_RDX_07;
      goto LAB_001210d5;
    }
    *(undefined4 *)((long)puVar3 + 0x1c) = 0x11;
    break;
  case 0x26:
    c_00 = Next(in_RSI);
    _Var6._M_pi = extraout_RDX_09;
    if (c_00 == '=') {
      *(undefined4 *)((long)puVar3 + 0x1c) = 0x20;
      goto LAB_001210d5;
    }
    if (c_00 == '&') {
      *(undefined4 *)((long)puVar3 + 0x1c) = 0x2b;
      goto LAB_001210d5;
    }
    *(undefined4 *)((long)puVar3 + 0x1c) = 0x23;
    break;
  case 0x27:
    iVar2 = ScanChar(in_RSI);
    *(int *)((long)puVar3 + 0x14) = iVar2;
    *(undefined4 *)((long)puVar3 + 0x1c) = 0x2e;
    c_00 = Next(in_RSI);
    _Var6._M_pi = extraout_RDX_06;
    if (c_00 == '\'') goto LAB_001210d5;
    pEVar1 = in_RSI->reporter_;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Char literal should end in quote","");
    ErrorReporter::Report(pEVar1,&local_90,c_00,in_RSI->line_,in_RSI->c_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    break;
  case 0x28:
    *(undefined4 *)((long)puVar3 + 0x1c) = 1;
    goto LAB_001210d5;
  case 0x29:
    *(undefined4 *)((long)puVar3 + 0x1c) = 2;
    goto LAB_001210d5;
  case 0x2a:
    c_00 = Next(in_RSI);
    if (c_00 == '=') {
      *(undefined4 *)((long)puVar3 + 0x1c) = 0x1b;
      _Var6._M_pi = extraout_RDX_08;
      goto LAB_001210d5;
    }
    *(undefined4 *)((long)puVar3 + 0x1c) = 0xf;
    break;
  case 0x2b:
    c_00 = Next(in_RSI);
    _Var6._M_pi = extraout_RDX_10;
    if (c_00 == '=') {
      *(undefined4 *)((long)puVar3 + 0x1c) = 0x19;
      goto LAB_001210d5;
    }
    if (c_00 == '+') {
      *(undefined4 *)((long)puVar3 + 0x1c) = 0x26;
      goto LAB_001210d5;
    }
    *(undefined4 *)((long)puVar3 + 0x1c) = 0xd;
    break;
  case 0x2c:
    *(undefined4 *)((long)puVar3 + 0x1c) = 5;
    goto LAB_001210d5;
  case 0x2d:
    c_00 = Next(in_RSI);
    _Var6._M_pi = extraout_RDX_15;
    if (c_00 == '>') {
      *(undefined4 *)((long)puVar3 + 0x1c) = 10;
      goto LAB_001210d5;
    }
    if (c_00 == '=') {
      *(undefined4 *)((long)puVar3 + 0x1c) = 0x1a;
      goto LAB_001210d5;
    }
    if (c_00 == '-') {
      *(undefined4 *)((long)puVar3 + 0x1c) = 0x27;
      goto LAB_001210d5;
    }
    *(undefined4 *)((long)puVar3 + 0x1c) = 0xe;
    break;
  case 0x2e:
    *(undefined4 *)((long)puVar3 + 0x1c) = 9;
    goto LAB_001210d5;
  case 0x2f:
    c_00 = Next(in_RSI);
    if (c_00 == '=') {
      *(undefined4 *)((long)puVar3 + 0x1c) = 0x1c;
      _Var6._M_pi = extraout_RDX_05;
      goto LAB_001210d5;
    }
    *(undefined4 *)((long)puVar3 + 0x1c) = 0x10;
    break;
  case 0x3a:
    *(undefined4 *)((long)puVar3 + 0x1c) = 0x29;
    goto LAB_001210d5;
  case 0x3b:
    *(undefined4 *)((long)puVar3 + 0x1c) = 6;
    goto LAB_001210d5;
  case 0x3c:
    c_00 = Next(in_RSI);
    if (c_00 == '<') {
      c_00 = Next(in_RSI);
      if (c_00 == '=') {
        *(undefined4 *)((long)puVar3 + 0x1c) = 0x1e;
        _Var6._M_pi = extraout_RDX_18;
        goto LAB_001210d5;
      }
      *(undefined4 *)((long)puVar3 + 0x1c) = 0x2c;
    }
    else {
      if (c_00 == '=') {
        *(undefined4 *)((long)puVar3 + 0x1c) = 0x16;
        _Var6._M_pi = extraout_RDX_13;
        goto LAB_001210d5;
      }
      *(undefined4 *)((long)puVar3 + 0x1c) = 0x14;
    }
    break;
  case 0x3d:
    c_00 = Next(in_RSI);
    if (c_00 == '=') {
      *(undefined4 *)((long)puVar3 + 0x1c) = 0x12;
      _Var6._M_pi = extraout_RDX_14;
      goto LAB_001210d5;
    }
    *(undefined4 *)((long)puVar3 + 0x1c) = 0x18;
    break;
  case 0x3e:
    c_00 = Next(in_RSI);
    if (c_00 == '>') {
      c_00 = Next(in_RSI);
      if (c_00 == '=') {
        *(undefined4 *)((long)puVar3 + 0x1c) = 0x1f;
        _Var6._M_pi = extraout_RDX_17;
        goto LAB_001210d5;
      }
      *(undefined4 *)((long)puVar3 + 0x1c) = 0x2d;
    }
    else {
      if (c_00 == '=') {
        *(undefined4 *)((long)puVar3 + 0x1c) = 0x17;
        _Var6._M_pi = extraout_RDX_04;
        goto LAB_001210d5;
      }
      *(undefined4 *)((long)puVar3 + 0x1c) = 0x15;
    }
    break;
  case 0x3f:
    *(undefined4 *)((long)puVar3 + 0x1c) = 0x28;
    goto LAB_001210d5;
  default:
    if (c == 0x5b) {
      *(undefined4 *)((long)puVar3 + 0x1c) = 0xb;
      goto LAB_001210d5;
    }
switchD_00120b5c_caseD_23:
    int_value = (int)(char)c - 0x30;
    if (int_value < 10) {
      iVar2 = ScanInt(in_RSI,int_value);
      *(int *)((long)puVar3 + 0x14) = iVar2;
      *(undefined4 *)((long)puVar3 + 0x1c) = 0x2e;
      _Var6._M_pi = extraout_RDX_02;
    }
    else {
      iVar2 = isalpha((int)(char)c);
      if ((c == 0x5f) || (iVar2 != 0)) {
        ScanIdent_abi_cxx11_(&local_90,in_RSI,c);
        cVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::TokenType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::TokenType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::TokenType>_>_>
                ::find(&(in_RSI->keywords_)._M_t,&local_90);
        if ((_Rb_tree_header *)cVar4._M_node ==
            &(in_RSI->keywords_)._M_t._M_impl.super__Rb_tree_header) {
          *(undefined4 *)((long)puVar3 + 0x1c) = 0x30;
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_70,local_90._M_dataplus._M_p,
                     local_90._M_dataplus._M_p + local_90._M_string_length);
          std::__cxx11::string::operator=((string *)(puVar3 + 4),(string *)local_70);
          _Var6._M_pi = extraout_RDX_21;
          if (local_70[0] != local_60) {
            operator_delete(local_70[0],local_60[0] + 1);
            _Var6._M_pi = extraout_RDX_22;
          }
        }
        else {
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::TokenType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::TokenType>_>_>
                   ::operator[](&in_RSI->keywords_,&local_90);
          *(mapped_type *)((long)puVar3 + 0x1c) = *pmVar5;
          _Var6._M_pi = extraout_RDX_19;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_001210d5;
      }
      else {
        pEVar1 = in_RSI->reporter_;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"Unrecognizable token","");
        ErrorReporter::Report(pEVar1,&local_90,c,in_RSI->line_,in_RSI->c_);
        _Var6._M_pi = extraout_RDX_16;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_001210d5;
      }
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      _Var6._M_pi = extraout_RDX_23;
    }
    goto LAB_001210d5;
  }
LAB_001210c9:
  Putback(in_RSI,c_00);
  _Var6._M_pi = extraout_RDX_20;
LAB_001210d5:
  sVar7.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi;
  sVar7.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<mcc::Token>)sVar7.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Token> Scanner::GetToken() {
  char c = NextCharSkipSpaces();
  std::shared_ptr<Token> token = std::make_shared<Token>();
  token->SetLine(line_);
  token->SetCount(c_);
  switch (c) {
    case '+':
      if ((c = Next()) == '+') {
        token->SetType(TokenType::T_INC);
      } else if (c == '=') {
        token->SetType(TokenType::T_ASSIGN_PLUS);
      } else {
        token->SetType(TokenType::T_PLUS);
        Putback(c);
      }
      break;
    case '-':
      if ((c = Next()) == '-') {
        token->SetType(TokenType::T_DEC);
      } else if (c == '>') {
        token->SetType(TokenType::T_ARROW);
      } else if (c == '=') {
        token->SetType(TokenType::T_ASSIGN_MINUS);
      } else {
        token->SetType(TokenType::T_MINUS);
        Putback(c);
      }
      break;
    case '*':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_ASSIGN_MUL);
      } else {
        token->SetType(TokenType::T_STAR);
        Putback(c);
      }
      break;
    case '/':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_ASSIGN_DIV);
      } else {
        token->SetType(TokenType::T_SLASH);
        Putback(c);
      }
      break;
    case '%':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_ASSIGN_MOD);
      } else {
        token->SetType(TokenType::T_MOD);
        Putback(c);
      }
      break;
    case ',':
      token->SetType(TokenType::T_COMMA);
      break;
    case '.':
      token->SetType(TokenType::T_DOT);
      break;
    case ':':
      token->SetType(TokenType::T_COLON);
      break;
    case '?':
      token->SetType(TokenType::T_QUESTION);
      break;
    case '[':
      token->SetType(TokenType::T_LBRACKET);
      break;
    case ']':
      token->SetType(TokenType::T_RBRACKET);
      break;
    case ';':
      token->SetType(TokenType::T_SEMICOLON);
      break;
    case '(':
      token->SetType(TokenType::T_LPAREN);
      break;
    case ')':
      token->SetType(TokenType::T_RPAREN);
      break;
    case '{':
      token->SetType(TokenType::T_LBRACE);
      break;
    case '}':
      token->SetType(TokenType::T_RBRACE);
      break;
    case '\'':
      token->SetInt(ScanChar());
      token->SetType(TokenType::T_INT_LIT);
      if ((c = Next()) != '\'') {
        reporter_.Report("Char literal should end in quote", c, line_, c_);
        Putback(c);
      }
      break;
    case '"':token->SetString(ScanStr());
      token->SetType(TokenType::T_STR_LIT);
      break;
    case '&':
      if ((c = Next()) == '&') {
        token->SetType(TokenType::T_AND);
      } else if (c == '=') {
        token->SetType(TokenType::T_ASSIGN_AND);
      } else {
        token->SetType(TokenType::T_BIT_AND);
        Putback(c);
      }
      break;
    case '|':
      if ((c = Next()) == '|') {
        token->SetType(TokenType::T_OR);
      } else if (c == '=') {
        token->SetType(TokenType::T_ASSIGN_OR);
      } else {
        token->SetType(TokenType::T_BIT_OR);
        Putback(c);
      }
      break;
    case '^':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_ASSIGN_XOR);
      } else {
        token->SetType(TokenType::T_BIT_XOR);
        Putback(c);
      }
      break;
    case '>':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_GREATER_EQUAL);
      } else if (c == '>') {
        if ((c = Next()) == '=') {
          token->SetType(TokenType::T_ASSIGN_RSHIFT);
        } else {
          token->SetType(TokenType::T_RSHIFT);
          Putback(c);
        }
      } else {
        token->SetType(TokenType::T_GREATER);
        Putback(c);
      }
      break;
    case '<':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_LESS_EQUAL);
      } else if (c == '<') {
        if ((c = Next()) == '=') {
          token->SetType(TokenType::T_ASSIGN_LSHIFT);
        } else {
          token->SetType(TokenType::T_LSHIFT);
          Putback(c);
        }
      } else {
        token->SetType(TokenType::T_LESS);
        Putback(c);
      }
      break;
    case '~':
      token->SetType(TokenType::T_NEG);
      break;
    case '!':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_NOT_EQUALS);
      } else {
        token->SetType(TokenType::T_NOT);
        Putback(c);
      }
      break;
    case '=':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_EQUALS);
      } else {
        token->SetType(TokenType::T_ASSIGN);
        Putback(c);
      }
      break;
    case EOF:
      token->SetType(TokenType::T_EOF);
      break;
    default:
      if (std::isdigit(c)) {
        int value = ScanInt(c - '0');
        token->SetInt(value);
        token->SetType(TokenType::T_INT_LIT);
      } else if (std::isalpha(c) || c == '_') {
        std::string identifier = ScanIdent(c);
        if (IsKeyword(identifier)) {
          token->SetType(GetKeywordToken(identifier));
        } else {
          token->SetType(TokenType::T_IDENTIFIER);
          token->SetString(identifier);
        }
      } else {
        reporter_.Report("Unrecognizable token", c, line_, c_);
      }
  }

  return token;
}